

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::getWordVector(FastText *this,Vector *vec,string *word,int factor,float addWo)

{
  undefined1 auVar1 [16];
  int32_t iVar2;
  int i;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  undefined1 in_ZMM1 [64];
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  Dictionary::getSubwords
            ((vector<int,_std::allocator<int>_> *)&local_40,
             (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,word);
  Vector::zero(vec);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_40._M_impl.super__Vector_impl_data._M_start >> 2);
      uVar4 = uVar4 + 1) {
    addInputVector(this,vec,local_40._M_impl.super__Vector_impl_data._M_start[uVar4]);
  }
  uVar3 = ~(factor >> 0x1f) & factor;
  while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
    addInputVector(this,vec,*local_40._M_impl.super__Vector_impl_data._M_start);
  }
  if ((long)local_40._M_impl.super__Vector_impl_data._M_finish -
      (long)local_40._M_impl.super__Vector_impl_data._M_start != 0) {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,
                                (long)factor +
                                ((long)local_40._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_40._M_impl.super__Vector_impl_data._M_start >> 2));
    Vector::mul(vec,(float)(1.0 / auVar1._0_8_));
  }
  if (0.0 < addWo) {
    iVar2 = Dictionary::getId((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr,word);
    Vector::addRow(vec,(this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (long)iVar2,addWo);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void FastText::getWordVector(Vector& vec, const std::string& word, int factor, float addWo) const {
  const std::vector<int32_t>& ngrams = dict_->getSubwords(word);
  vec.zero();
  for (int i = 0; i < ngrams.size(); i++) {
    addInputVector(vec, ngrams[i]);
  }
  for (int i = 0; i < factor; i++) {
    addInputVector(vec,ngrams[0]);//控制subwords中word emb和subword/char emb的加权
  }
  if (ngrams.size() > 0) {
    vec.mul(1.0 / (ngrams.size()+factor));
  }
  if (addWo > 0) {
    const int id = dict_->getId(word);
    vec.addRow(*output_, id, addWo);
  }
}